

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

LogHandler * google::protobuf::SetLogHandler(LogHandler *new_func)

{
  undefined *puVar1;
  LogHandler *pLVar2;
  
  puVar1 = internal::log_handler__abi_cxx11_;
  if (new_func == (LogHandler *)0x0) {
    new_func = internal::NullLogHandler;
  }
  internal::log_handler__abi_cxx11_ = new_func;
  pLVar2 = (LogHandler *)0x0;
  if ((code *)puVar1 != internal::NullLogHandler) {
    pLVar2 = (LogHandler *)puVar1;
  }
  return pLVar2;
}

Assistant:

LogHandler* SetLogHandler(LogHandler* new_func) {
  LogHandler* old = internal::log_handler_;
  if (old == &internal::NullLogHandler) {
    old = nullptr;
  }
  if (new_func == nullptr) {
    internal::log_handler_ = &internal::NullLogHandler;
  } else {
    internal::log_handler_ = new_func;
  }
  return old;
}